

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

void __thiscall
fasttext::DenseMatrix::addVectorToRow(DenseMatrix *this,Vector *vec,int64_t i,real a)

{
  undefined1 auVar1 [16];
  pointer pfVar2;
  real *prVar3;
  reference pvVar4;
  long in_RDX;
  Vector *in_RDI;
  uint in_XMM0_Da;
  int64_t j;
  real in_stack_ffffffffffffffc8;
  uint uVar5;
  long local_28;
  
  if (in_RDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x7b,
                  "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)"
                 );
  }
  if (in_RDX < (long)(in_RDI->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish) {
    pfVar2 = (pointer)Vector::size((Vector *)0x1e0917);
    if (pfVar2 == (in_RDI->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      for (local_28 = 0;
          local_28 <
          (long)(in_RDI->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage; local_28 = local_28 + 1) {
        uVar5 = in_XMM0_Da;
        prVar3 = Vector::operator[](in_RDI,CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffc8));
        in_stack_ffffffffffffffc8 = *prVar3;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&in_RDI[1].data_,
                            in_RDX * (long)(in_RDI->data_).
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_end_of_storage + local_28);
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_stack_ffffffffffffffc8),ZEXT416(uVar5),
                                 ZEXT416((uint)*pvVar4));
        *pvVar4 = auVar1._0_4_;
      }
      return;
    }
    __assert_fail("vec.size() == n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x7d,
                  "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)"
                 );
  }
  __assert_fail("i < m_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                ,0x7c,
                "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)")
  ;
}

Assistant:

void DenseMatrix::addVectorToRow(const Vector& vec, int64_t i, real a) {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  for (int64_t j = 0; j < n_; j++) {
    data_[i * n_ + j] += a * vec[j];
  }
}